

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleBroadphase.cpp
# Opt level: O0

void __thiscall
btSimpleBroadphase::btSimpleBroadphase
          (btSimpleBroadphase *this,int maxProxies,btOverlappingPairCache *overlappingPairCache)

{
  undefined1 auVar1 [16];
  _func_int **pp_Var2;
  ulong uVar3;
  size_t sVar4;
  _func_int **in_RDX;
  int in_ESI;
  btBroadphaseInterface *in_RDI;
  int i;
  void *mem;
  int in_stack_ffffffffffffff7c;
  size_t in_stack_ffffffffffffff80;
  _func_int **local_70;
  btHashedOverlappingPairCache *in_stack_ffffffffffffffa0;
  int local_30;
  
  btBroadphaseInterface::btBroadphaseInterface(in_RDI);
  in_RDI->_vptr_btBroadphaseInterface = (_func_int **)&PTR__btSimpleBroadphase_002e2430;
  in_RDI[6]._vptr_btBroadphaseInterface = in_RDX;
  *(undefined1 *)&in_RDI[7]._vptr_btBroadphaseInterface = 0;
  *(undefined4 *)((long)&in_RDI[7]._vptr_btBroadphaseInterface + 4) = 0;
  if (in_RDX == (_func_int **)0x0) {
    pp_Var2 = (_func_int **)
              btAlignedAllocInternal(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    btHashedOverlappingPairCache::btHashedOverlappingPairCache(in_stack_ffffffffffffffa0);
    in_RDI[6]._vptr_btBroadphaseInterface = pp_Var2;
    *(undefined1 *)&in_RDI[7]._vptr_btBroadphaseInterface = 1;
  }
  pp_Var2 = (_func_int **)
            btAlignedAllocInternal(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  in_RDI[4]._vptr_btBroadphaseInterface = pp_Var2;
  uVar3 = (ulong)in_ESI;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  sVar4 = SUB168(auVar1 * ZEXT816(0x40),0);
  if (SUB168(auVar1 * ZEXT816(0x40),8) != 0) {
    sVar4 = 0xffffffffffffffff;
  }
  pp_Var2 = (_func_int **)
            btBroadphaseProxy::operator_new__(sVar4,in_RDI[4]._vptr_btBroadphaseInterface);
  if (uVar3 != 0) {
    local_70 = pp_Var2;
    do {
      btSimpleBroadphaseProxy::btSimpleBroadphaseProxy((btSimpleBroadphaseProxy *)0x16f9ab);
      local_70 = local_70 + 8;
    } while (local_70 != pp_Var2 + uVar3 * 8);
  }
  in_RDI[3]._vptr_btBroadphaseInterface = pp_Var2;
  *(int *)((long)&in_RDI[1]._vptr_btBroadphaseInterface + 4) = in_ESI;
  *(undefined4 *)&in_RDI[1]._vptr_btBroadphaseInterface = 0;
  *(undefined4 *)&in_RDI[5]._vptr_btBroadphaseInterface = 0;
  *(undefined4 *)&in_RDI[2]._vptr_btBroadphaseInterface = 0xffffffff;
  for (local_30 = *(int *)&in_RDI[5]._vptr_btBroadphaseInterface; local_30 < in_ESI;
      local_30 = local_30 + 1) {
    btSimpleBroadphaseProxy::SetNextFree
              ((btSimpleBroadphaseProxy *)
               (in_RDI[3]._vptr_btBroadphaseInterface + (long)local_30 * 8),local_30 + 1);
    *(int *)(in_RDI[3]._vptr_btBroadphaseInterface + (long)local_30 * 8 + 3) = local_30 + 2;
  }
  btSimpleBroadphaseProxy::SetNextFree
            ((btSimpleBroadphaseProxy *)
             (in_RDI[3]._vptr_btBroadphaseInterface + (long)(in_ESI + -1) * 8),0);
  return;
}

Assistant:

btSimpleBroadphase::btSimpleBroadphase(int maxProxies, btOverlappingPairCache* overlappingPairCache)
	:m_pairCache(overlappingPairCache),
	m_ownsPairCache(false),
	m_invalidPair(0)
{

	if (!overlappingPairCache)
	{
		void* mem = btAlignedAlloc(sizeof(btHashedOverlappingPairCache),16);
		m_pairCache = new (mem)btHashedOverlappingPairCache();
		m_ownsPairCache = true;
	}

	// allocate handles buffer and put all handles on free list
	m_pHandlesRawPtr = btAlignedAlloc(sizeof(btSimpleBroadphaseProxy)*maxProxies,16);
	m_pHandles = new(m_pHandlesRawPtr) btSimpleBroadphaseProxy[maxProxies];
	m_maxHandles = maxProxies;
	m_numHandles = 0;
	m_firstFreeHandle = 0;
	m_LastHandleIndex = -1;
	

	{
		for (int i = m_firstFreeHandle; i < maxProxies; i++)
		{
			m_pHandles[i].SetNextFree(i + 1);
			m_pHandles[i].m_uniqueId = i+2;//any UID will do, we just avoid too trivial values (0,1) for debugging purposes
		}
		m_pHandles[maxProxies - 1].SetNextFree(0);
	
	}

}